

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_bitset_container_intersection_cardinality(run_container_t *src_1,bitset_container_t *src_2)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  _Var1 = run_container_is_full(src_1);
  if (_Var1) {
    iVar3 = src_2->cardinality;
  }
  else {
    uVar4 = 0;
    uVar5 = (ulong)(uint)src_1->n_runs;
    if (src_1->n_runs < 1) {
      uVar5 = uVar4;
    }
    iVar3 = 0;
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = bitset_lenrange_cardinality
                        (src_2->words,(uint)src_1->runs[uVar4].value,(uint)src_1->runs[uVar4].length
                        );
      iVar3 = iVar3 + iVar2;
    }
  }
  return iVar3;
}

Assistant:

int run_bitset_container_intersection_cardinality(
    const run_container_t *src_1, const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return bitset_container_cardinality(src_2);
    }
    int answer = 0;
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        answer +=
            bitset_lenrange_cardinality(src_2->words, rle.value, rle.length);
    }
    return answer;
}